

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

uint8_t * bytesToHexString_abi_cxx11_(uint8_t *str,uint64_t s)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  undefined8 uVar3;
  ostream *poVar4;
  void *this;
  ulong in_RDX;
  ulong local_1a0;
  size_t i;
  ostringstream ret;
  uint64_t s_local;
  uint8_t *str_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&i);
  for (local_1a0 = 0; local_1a0 < in_RDX; local_1a0 = local_1a0 + 1) {
    uVar3 = std::ostream::operator<<(&i,std::hex);
    _Var1 = std::setfill<char>('0');
    poVar4 = std::operator<<(uVar3,_Var1._M_c);
    _Var2 = std::setw(2);
    poVar4 = std::operator<<(poVar4,_Var2);
    this = (void *)std::ostream::operator<<(poVar4,std::nouppercase);
    std::ostream::operator<<(this,(uint)*(byte *)(s + local_1a0));
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&i);
  return str;
}

Assistant:

std::string bytesToHexString(const uint8_t *str, const uint64_t s)
{
	std::ostringstream ret;

	for (size_t i = 0; i < s; ++i)
		ret << std::hex << std::setfill('0') << std::setw(2) << std::nouppercase << (int) str[i];

	return ret.str();
}